

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# covariance_matrix_generator.cc
# Opt level: O2

void webrtc::CovarianceMatrixGenerator::PhaseAlignmentMasks
               (size_t frequency_bin,size_t fft_size,int sample_rate,float sound_speed,
               vector<webrtc::CartesianPoint<float>,_std::allocator<webrtc::CartesianPoint<float>_>_>
               *geometry,float angle,ComplexMatrix<float> *mat)

{
  float fVar1;
  pointer ppcVar2;
  double dVar3;
  double dVar4;
  int line;
  string *result;
  size_t c_ix;
  ulong uVar5;
  long lVar6;
  float fVar7;
  float fVar8;
  size_t local_1b0;
  FatalMessage local_1a8;
  
  local_1b0 = CONCAT44(local_1b0._4_4_,1);
  local_1a8._0_8_ = (mat->super_Matrix<std::complex<float>_>).num_rows_;
  result = rtc::CheckEQImpl<unsigned_int,unsigned_long>
                     ((uint *)&local_1b0,(unsigned_long *)&local_1a8,"1u == mat->num_rows()");
  if (result == (string *)0x0) {
    local_1a8._0_8_ =
         ((long)(geometry->
                super__Vector_base<webrtc::CartesianPoint<float>,_std::allocator<webrtc::CartesianPoint<float>_>_>
                )._M_impl.super__Vector_impl_data._M_finish -
         (long)(geometry->
               super__Vector_base<webrtc::CartesianPoint<float>,_std::allocator<webrtc::CartesianPoint<float>_>_>
               )._M_impl.super__Vector_impl_data._M_start) / 0xc;
    local_1b0 = (mat->super_Matrix<std::complex<float>_>).num_columns_;
    result = rtc::CheckEQImpl<unsigned_long,unsigned_long>
                       ((unsigned_long *)&local_1a8,&local_1b0,
                        "geometry.size() == mat->num_columns()");
    if (result == (string *)0x0) {
      ppcVar2 = (mat->super_Matrix<std::complex<float>_>).elements_.
                super__Vector_base<std::complex<float>_*,_std::allocator<std::complex<float>_*>_>.
                _M_impl.super__Vector_impl_data._M_start;
      lVar6 = 0;
      for (uVar5 = 0;
          uVar5 < (ulong)(((long)(geometry->
                                 super__Vector_base<webrtc::CartesianPoint<float>,_std::allocator<webrtc::CartesianPoint<float>_>_>
                                 )._M_impl.super__Vector_impl_data._M_finish -
                          (long)(geometry->
                                super__Vector_base<webrtc::CartesianPoint<float>,_std::allocator<webrtc::CartesianPoint<float>_>_>
                                )._M_impl.super__Vector_impl_data._M_start) / 0xc);
          uVar5 = uVar5 + 1) {
        fVar7 = cosf(angle);
        fVar1 = *(float *)((long)((geometry->
                                  super__Vector_base<webrtc::CartesianPoint<float>,_std::allocator<webrtc::CartesianPoint<float>_>_>
                                  )._M_impl.super__Vector_impl_data._M_start)->c + lVar6);
        fVar8 = sinf(angle);
        dVar3 = (double)(((fVar8 * *(float *)((long)((geometry->
                                                                                                          
                                                  super__Vector_base<webrtc::CartesianPoint<float>,_std::allocator<webrtc::CartesianPoint<float>_>_>
                                                  )._M_impl.super__Vector_impl_data._M_start)->c +
                                             lVar6 + 4) + fVar7 * fVar1) * -6.2831855 *
                         (float)sample_rate * ((float)frequency_bin / (float)fft_size)) /
                        sound_speed);
        dVar4 = cos(dVar3);
        dVar3 = sin(dVar3);
        (*ppcVar2)[uVar5]._M_value = CONCAT44((float)dVar3,(float)dVar4);
        lVar6 = lVar6 + 0xc;
      }
      return;
    }
    line = 0x62;
  }
  else {
    line = 0x61;
  }
  rtc::FatalMessage::FatalMessage
            (&local_1a8,
             "/workspace/llm4binary/github/license_c_cmakelists/ctwgL[P]webrtc-beamforming/webrtc/webrtc/modules/audio_processing/beamformer/covariance_matrix_generator.cc"
             ,line,result);
  rtc::FatalMessage::~FatalMessage(&local_1a8);
}

Assistant:

void CovarianceMatrixGenerator::PhaseAlignmentMasks(
    size_t frequency_bin,
    size_t fft_size,
    int sample_rate,
    float sound_speed,
    const std::vector<Point>& geometry,
    float angle,
    ComplexMatrix<float>* mat) {
  RTC_CHECK_EQ(1u, mat->num_rows());
  RTC_CHECK_EQ(geometry.size(), mat->num_columns());

  float freq_in_hertz =
      (static_cast<float>(frequency_bin) / fft_size) * sample_rate;

  complex<float>* const* mat_els = mat->elements();
  for (size_t c_ix = 0; c_ix < geometry.size(); ++c_ix) {
    float distance = std::cos(angle) * geometry[c_ix].x() +
                     std::sin(angle) * geometry[c_ix].y();
    float phase_shift = -2.f * M_PI * distance * freq_in_hertz / sound_speed;

    // Euler's formula for mat[0][c_ix] = e^(j * phase_shift).
    mat_els[0][c_ix] = complex<float>(cos(phase_shift), sin(phase_shift));
  }
}